

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::environmentquestion(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint src;
  int iVar2;
  string currentWord;
  
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  src = ForthStack<unsigned_int>::getTop(this_00);
  currentWord._M_dataplus._M_p = (pointer)&currentWord.field_2;
  currentWord._M_string_length = 0;
  currentWord.field_2._M_local_buf[0] = '\0';
  moveFromDataSpace(this,&currentWord,src,(ulong)uVar1);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&currentWord,"/COUNTED-STRING");
  uVar1 = 0xff;
  if ((iVar2 != 0) &&
     (iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&currentWord,"/HOLD"), iVar2 != 0)) {
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&currentWord,"ADDRESS-UNIT-BITS");
    if (iVar2 == 0) {
      uVar1 = 0x20;
    }
    else {
      iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&currentWord,"FLOORED");
      if (iVar2 == 0) {
        uVar1 = this->False;
      }
      else {
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&currentWord,"RETURN-STACK-CELLS");
        if (iVar2 == 0) {
          uVar1 = 100;
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&currentWord,"STACK-CELLS");
          if (iVar2 == 0) {
LAB_00119b65:
            uVar1 = 200;
          }
          else {
            iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&currentWord,"CORE");
            if (((iVar2 == 0) ||
                (iVar2 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&currentWord,"EXCEPTION"), iVar2 == 0)) ||
               (iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&currentWord,"FLOATING"), iVar2 == 0)) {
              uVar1 = this->True;
            }
            else {
              iVar2 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&currentWord,"WORDLISTS");
              uVar1 = 0x100;
              if ((iVar2 != 0) &&
                 (iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&currentWord,"#LOCALS"), iVar2 != 0)) {
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&currentWord,"FLOATING-STACK");
                if (iVar2 == 0) goto LAB_00119b65;
                iVar2 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&currentWord,"FLOATING");
                uVar1 = 200;
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&currentWord,"MAX-FLOAT");
                  if (iVar2 != 0) {
                    ForthStack<unsigned_int>::setTop(this_00,this->False);
                    goto LAB_00119b4a;
                  }
                  uVar1 = this->True;
                  ForthStack<double>::push(&this->fStack,1.79769313486232e+308);
                }
              }
            }
          }
        }
      }
    }
  }
  ForthStack<unsigned_int>::setTop(this_00,uVar1);
  ForthStack<unsigned_int>::push(this_00,this->True);
LAB_00119b4a:
  std::__cxx11::string::~string((string *)&currentWord);
  return;
}

Assistant:

void environmentquestion(){
			auto length = SIZE_T(dStack.getTop()); pop();
			auto caddr = CADDR(dStack.getTop());
			std::string currentWord{};
			moveFromDataSpace(currentWord, caddr, length);
			Cell ret = False;
			if (currentWord.compare("/COUNTED-STRING") == 0){
				ret = 255;
			} else 
			if (currentWord.compare("/HOLD") == 0){
					ret = 255;
			}
				else
			if (currentWord.compare("ADDRESS-UNIT-BITS") == 0){
						ret = sizeof(Cell)*8;
					}
					else
						if (currentWord.compare("FLOORED") == 0){
							ret = False;
						}
						else
							if (currentWord.compare("RETURN-STACK-CELLS") == 0){
								ret = 100;
							}
							else
								if (currentWord.compare("STACK-CELLS") == 0){
									ret = 200;
								}
								else
									if (currentWord.compare("CORE") == 0){
										ret = True;
									}
									else
										if (currentWord.compare("EXCEPTION") == 0){
											ret = True;
										}
										else
											if (currentWord.compare("FLOATING") == 0){
												ret = True;
											} 
										else
											if (currentWord.compare("WORDLISTS") == 0){
												ret = 256;
											} 
										else
											if (currentWord.compare("#LOCALS") == 0){
												ret = 256;
											} 

#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
			else if (currentWord.compare("FLOATING-STACK") == 0){
				ret = 200;
			}else if (currentWord.compare("FLOATING") == 0){
				ret = 200;
			} else
			if (currentWord.compare("MAX-FLOAT") == 0){
				ret = True;
				fStack.push(std::numeric_limits<FCell>::max());
			}
#endif
			else {
				dStack.setTop(False);
				return;
			}